

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O3

shared_ptr<cali::ConfigSetImpl> __thiscall
cali::RuntimeConfig::RuntimeConfigImpl::init_configset
          (RuntimeConfigImpl *this,char *name,config_entry_list_t *list)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  iterator __pos;
  ConfigSetImpl *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<cali::ConfigSetImpl> sVar4;
  allocator<char> local_89;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  char local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
  local_68;
  config_profile_t *local_38;
  
  if (*(long *)(name + 0x90) == 0) {
    init_config_database((RuntimeConfigImpl *)name);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,(char *)list,(allocator<char> *)&local_88);
  __pos = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
                  *)(name + 0x68),&local_68.first);
  _Var3._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
    _Var3._M_pi = extraout_RDX_00;
  }
  if (__pos._M_node == (_Base_ptr)(name + 0x70)) {
    __p = (ConfigSetImpl *)operator_new(0x38);
    (__p->m_dict)._M_h._M_buckets = &(__p->m_dict)._M_h._M_single_bucket;
    (__p->m_dict)._M_h._M_bucket_count = 1;
    (__p->m_dict)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p->m_dict)._M_h._M_element_count = 0;
    (__p->m_dict)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__p->m_dict)._M_h._M_rehash_policy._M_next_resize = 0;
    (__p->m_dict)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    *(ConfigSetImpl **)this = __p;
    local_38 = &this->m_combined_profile;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cali::ConfigSetImpl*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38,__p);
    ConfigSetImpl::init(*(ConfigSetImpl **)this,(EVP_PKEY_CTX *)list);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,(char *)list,&local_89);
    paVar1 = &local_68.first.field_2;
    if (local_88 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_78) {
      local_68.first.field_2._8_8_ = uStack_70;
      local_68.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_68.first._M_dataplus._M_p = (pointer)local_88;
    }
    local_68.first.field_2._M_allocated_capacity._1_7_ = uStack_77;
    local_68.first.field_2._M_local_buf[0] = local_78;
    local_68.first._M_string_length = local_80;
    local_80 = 0;
    local_78 = '\0';
    local_68.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)this;
    local_68.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             &(this->m_combined_profile)._M_t._M_impl;
    if (local_68.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_68.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_68.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_78;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>>
    ::_M_emplace_hint_unique<std::pair<std::__cxx11::string,std::shared_ptr<cali::ConfigSetImpl>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>>
                *)(name + 0x68),(const_iterator)__pos._M_node,&local_68);
    _Var3._M_pi = extraout_RDX_01;
    if (local_68.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.second.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      _Var3._M_pi = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.first._M_dataplus._M_p,
                      local_68.first.field_2._M_allocated_capacity + 1);
      _Var3._M_pi = extraout_RDX_03;
    }
    if (local_88 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
      _Var3._M_pi = extraout_RDX_04;
    }
  }
  else {
    *(undefined8 *)this = *(undefined8 *)(__pos._M_node + 2);
    p_Var2 = __pos._M_node[2]._M_parent;
    *(_Base_ptr *)&(this->m_combined_profile)._M_t._M_impl = p_Var2;
    if (p_Var2 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
      }
    }
  }
  sVar4.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cali::ConfigSetImpl>)
         sVar4.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ConfigSetImpl> init_configset(const char* name, const config_entry_list_t& list)
    {
        if (m_database.empty())
            init_config_database();

        auto it = m_database.find(name);

        if (it != m_database.end())
            return it->second;

        std::shared_ptr<ConfigSetImpl> ret { new ConfigSetImpl };

        ret->init(name, list, m_allow_read_env, m_combined_profile, m_top_profile);
        m_database.insert(it, make_pair(std::string(name), ret));

        return ret;
    }